

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

u32string * __thiscall
cs::codecvt::gbk::local2wide_abi_cxx11_(gbk *this,deque<char,_std::allocator<char>_> *local)

{
  bool bVar1;
  reference pcVar2;
  byte *pbVar3;
  string *str;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *in_RDI;
  uint8_t tail;
  const_iterator it;
  bool read_next;
  uint32_t head;
  u32string wide;
  _Self *in_stack_fffffffffffffed8;
  _Self *in_stack_fffffffffffffee0;
  int iVar4;
  compile_error *this_00;
  _Deque_iterator<char,_const_char_&,_const_char_*> *in_stack_fffffffffffffee8;
  char32_t in_stack_fffffffffffffef0;
  char32_t in_stack_fffffffffffffef4;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *this_01;
  undefined1 local_f1 [33];
  _Deque_iterator<char,_const_char_&,_const_char_*> local_d0;
  byte local_ad;
  _Deque_iterator<char,_const_char_&,_const_char_*> local_a0 [3];
  byte local_3d;
  char32_t local_3c;
  
  this_01 = in_RDI;
  std::__cxx11::u32string::u32string(in_RDI);
  local_3c = L'\0';
  local_3d = 1;
  std::deque<char,_std::allocator<char>_>::begin
            ((deque<char,_std::allocator<char>_> *)in_stack_fffffffffffffed8);
  while( true ) {
    std::deque<char,_std::allocator<char>_>::end
              ((deque<char,_std::allocator<char>_> *)in_stack_fffffffffffffed8);
    bVar1 = std::operator!=(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    if (!bVar1) break;
    iVar4 = (int)((ulong)in_stack_fffffffffffffee0 >> 0x20);
    if ((local_3d & 1) == 0) {
      in_stack_fffffffffffffee8 = &local_d0;
      std::_Deque_iterator<char,_const_char_&,_const_char_*>::operator++
                (in_stack_fffffffffffffee8,iVar4);
      pbVar3 = (byte *)std::_Deque_iterator<char,_const_char_&,_const_char_*>::operator*
                                 (in_stack_fffffffffffffee8);
      local_ad = *pbVar3;
      in_stack_fffffffffffffef0 = set_zero(local_3c << 8 | (uint)local_ad);
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      push_back((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                (char32_t)((ulong)in_stack_fffffffffffffee8 >> 0x20));
      local_3d = 1;
    }
    else {
      std::_Deque_iterator<char,_const_char_&,_const_char_*>::operator++
                (in_stack_fffffffffffffee8,iVar4);
      pcVar2 = std::_Deque_iterator<char,_const_char_&,_const_char_*>::operator*(local_a0);
      local_3c = (char32_t)*pcVar2;
      if ((local_3c & 0x80U) == 0) {
        in_stack_fffffffffffffef4 = set_zero(local_3c);
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::push_back((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *
                    )CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                    (char32_t)((ulong)in_stack_fffffffffffffee8 >> 0x20));
      }
      else {
        local_3d = 0;
      }
    }
  }
  if ((local_3d & 1) != 0) {
    std::__cxx11::u32string::u32string(this_01,in_RDI);
    std::__cxx11::u32string::~u32string
              ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               in_stack_fffffffffffffee0);
    return this_01;
  }
  str = (string *)__cxa_allocate_exception(0x28);
  this_00 = (compile_error *)local_f1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_f1 + 1),"Codecvt: Bad encoding.",(allocator *)this_00);
  compile_error::compile_error(this_00,str);
  __cxa_throw(str,&compile_error::typeinfo,compile_error::~compile_error);
}

Assistant:

std::u32string local2wide(const std::deque<char> &local) override
			{
				std::u32string wide;
				uint32_t head = 0;
				bool read_next = true;
				for (auto it = local.begin(); it != local.end();) {
					if (read_next) {
						head = *(it++);
						if (head & u8_blck_begin)
							read_next = false;
						else
							wide.push_back(set_zero(head));
					}
					else {
						std::uint8_t tail = *(it++);
						wide.push_back(set_zero(head << 8 | tail));
						read_next = true;
					}
				}
				if (!read_next)
					throw compile_error("Codecvt: Bad encoding.");
				return std::move(wide);
			}